

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedCompanion.cc
# Opt level: O0

void __thiscall Glucose::SharedCompanion::SharedCompanion(SharedCompanion *this,int _nbThreads)

{
  uint uVar1;
  uint in_ESI;
  long in_RDI;
  undefined8 in_stack_ffffffffffffffa8;
  int _nbThreads_00;
  FILE *__stream;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ClausesBuffer *in_stack_ffffffffffffffe0;
  
  _nbThreads_00 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  SolverCompanion::SolverCompanion((SolverCompanion *)0x11799c);
  ClausesBuffer::ClausesBuffer(in_stack_ffffffffffffffe0);
  *(uint *)(in_RDI + 0x58) = in_ESI;
  *(undefined1 *)(in_RDI + 0x100) = 0;
  *(undefined8 *)(in_RDI + 0x108) = 0;
  *(undefined1 *)(in_RDI + 0x110) = 0;
  lbool::lbool((lbool *)(in_RDI + 0x111),'\x02');
  vec<int>::vec((vec<int> *)(in_RDI + 0x118));
  vec<Glucose::Lit>::vec((vec<Glucose::Lit> *)(in_RDI + 0x128));
  vec<Glucose::lbool>::vec((vec<Glucose::lbool> *)(in_RDI + 0x138));
  *(undefined8 *)(in_RDI + 0x148) = 0x41617b0320000000;
  pthread_mutex_init((pthread_mutex_t *)(in_RDI + 0x88),(pthread_mutexattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)(in_RDI + 0xb0),(pthread_mutexattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)(in_RDI + 0x60),(pthread_mutexattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)(in_RDI + 0xd8),(pthread_mutexattr_t *)0x0);
  if (0 < (int)in_ESI) {
    setNbThreads((SharedCompanion *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 _nbThreads_00);
    __stream = _stdout;
    uVar1 = ClausesBuffer::maxSize((ClausesBuffer *)(in_RDI + 0x10));
    fprintf(__stream,
            "c Shared companion initialized: handling of clauses of %d threads.\nc %d ints for the sharing clause buffer (not expandable) .\n"
            ,(ulong)in_ESI,(ulong)uVar1);
  }
  return;
}

Assistant:

SharedCompanion::SharedCompanion(int _nbThreads) :
    nbThreads(_nbThreads), 
    bjobFinished(false),
    jobFinishedBy(NULL),
    panicMode(false), // The bug in the SAT2014 competition :)
    jobStatus(l_Undef),
    random_seed(9164825) {

	pthread_mutex_init(&mutexSharedClauseCompanion,NULL); // This is the shared companion lock
	pthread_mutex_init(&mutexSharedUnitCompanion,NULL); // This is the shared companion lock
	pthread_mutex_init(&mutexSharedCompanion,NULL); // This is the shared companion lock
	pthread_mutex_init(&mutexJobFinished,NULL); // This is the shared companion lock
	if (_nbThreads> 0)  {
	    setNbThreads(_nbThreads);
	    fprintf(stdout,"c Shared companion initialized: handling of clauses of %d threads.\nc %d ints for the sharing clause buffer (not expandable) .\n", _nbThreads, clausesBuffer.maxSize());
	}

}